

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::ipc::HostImpl::HostImpl(HostImpl *this,char *socket_name,TaskRunner *task_runner)

{
  uint uVar1;
  TaskRunner *pTVar2;
  bool bVar3;
  char *fname;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [32];
  TaskRunner *task_runner_local;
  char *socket_name_local;
  HostImpl *this_local;
  
  local_38._24_8_ = task_runner;
  task_runner_local = (TaskRunner *)socket_name;
  socket_name_local = (char *)this;
  Host::Host(&this->super_Host);
  perfetto::base::UnixSocket::EventListener::EventListener(&this->super_EventListener);
  (this->super_Host)._vptr_Host = (_func_int **)&PTR__HostImpl_009c3990;
  (this->super_EventListener)._vptr_EventListener = (_func_int **)&PTR__HostImpl_009c39d8;
  this->task_runner_ = (TaskRunner *)local_38._24_8_;
  std::
  map<unsigned_int,_perfetto::ipc::HostImpl::ExposedService,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_perfetto::ipc::HostImpl::ExposedService>_>_>
  ::map(&this->services_);
  ::std::unique_ptr<perfetto::base::UnixSocket,std::default_delete<perfetto::base::UnixSocket>>::
  unique_ptr<std::default_delete<perfetto::base::UnixSocket>,void>
            ((unique_ptr<perfetto::base::UnixSocket,std::default_delete<perfetto::base::UnixSocket>>
              *)&this->sock_);
  std::
  map<unsigned_long,_std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,_std::default_delete<perfetto::ipc::HostImpl::ClientConnection>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<perfetto::ipc::HostImpl::ClientConnection,_std::default_delete<perfetto::ipc::HostImpl::ClientConnection>_>_>_>_>
  ::map(&this->clients_);
  std::
  map<perfetto::base::UnixSocket_*,_perfetto::ipc::HostImpl::ClientConnection_*,_std::less<perfetto::base::UnixSocket_*>,_std::allocator<std::pair<perfetto::base::UnixSocket_*const,_perfetto::ipc::HostImpl::ClientConnection_*>_>_>
  ::map(&this->clients_by_socket_);
  this->last_service_id_ = 0;
  this->last_client_id_ = 0;
  perfetto::base::WeakPtrFactory<perfetto::ipc::HostImpl>::WeakPtrFactory
            (&this->weak_ptr_factory_,this);
  pTVar2 = task_runner_local;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)pTVar2,&local_59)
  ;
  perfetto::base::UnixSocket::Listen
            ((UnixSocket *)local_38,&local_58,&this->super_EventListener,this->task_runner_,kUnix,
             kStream);
  std::unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
  operator=(&this->sock_,
            (unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
             *)local_38);
  std::unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
  ~unique_ptr((unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
               *)local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->sock_);
  if (!bVar3) {
    fname = perfetto::base::Basename
                      (
                      "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                      );
    pTVar2 = task_runner_local;
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    perfetto::base::LogMessage
              (kLogError,fname,0x1120b,"Failed to create %s (errno: %d, %s)",pTVar2,(ulong)uVar1,
               pcVar6);
  }
  return;
}

Assistant:

HostImpl::HostImpl(const char* socket_name, base::TaskRunner* task_runner)
    : task_runner_(task_runner), weak_ptr_factory_(this) {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  sock_ = base::UnixSocket::Listen(socket_name, this, task_runner_,
                                   kHostSockFamily, base::SockType::kStream);
  if (!sock_) {
    PERFETTO_PLOG("Failed to create %s", socket_name);
  }
}